

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roboclaw.cpp
# Opt level: O0

bool __thiscall RoboClaw::ReadMinMaxMainVoltages(RoboClaw *this,uint16_t *min,uint16_t *max)

{
  uint32_t uVar1;
  bool *in_RDX;
  undefined2 *in_RSI;
  RoboClaw *in_RDI;
  uint32_t value;
  bool valid;
  undefined1 local_19;
  
  uVar1 = Read4(in_RDI,(uint8_t)((ulong)in_RSI >> 0x38),(uint8_t)((ulong)in_RSI >> 0x30),in_RDX);
  if ((local_19 & 1) != 0) {
    *in_RSI = (short)(uVar1 >> 0x10);
    *(short *)in_RDX = (short)uVar1;
  }
  return (bool)(local_19 & 1);
}

Assistant:

bool RoboClaw::ReadMinMaxMainVoltages( uint16_t &min,uint16_t &max)
{
    bool valid;
    uint32_t value = Read4( m_address, GETMINMAXMAINVOLTAGES,&valid);
    if(valid)
    {
        min = value>>16;
        max = value&0xFFFF;
    }
    return valid;
}